

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  int iVar1;
  xmlRegExecCtxtPtr exec_00;
  xmlRegExecCtxtPtr exec;
  int ret;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->elem == (xmlRegExecCtxtPtr)0x0)) ||
     (elem == (xmlNodePtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    exec_00 = xmlRelaxNGElemPop(ctxt);
    iVar1 = xmlRegExecPushString(exec_00,(xmlChar *)0x0,(void *)0x0);
    if (iVar1 == 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0);
      exec._4_4_ = -1;
    }
    else if (iVar1 < 0) {
      exec._4_4_ = -1;
    }
    else {
      exec._4_4_ = 1;
    }
    xmlRegFreeExecCtxt(exec_00);
    ctxt_local._4_4_ = exec._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlDocPtr doc ATTRIBUTE_UNUSED,
                             xmlNodePtr elem)
{
    int ret;
    xmlRegExecCtxtPtr exec;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (elem == NULL))
        return (-1);
    /*
     * verify that we reached a terminal state of the content model.
     */
    exec = xmlRelaxNGElemPop(ctxt);
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
    } else if (ret < 0) {
        ret = -1;
    } else {
        ret = 1;
    }
    xmlRegFreeExecCtxt(exec);
    return (ret);
}